

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

int duckdb_je_mallctl(char *name,void *oldp,size_t *oldlenp,void *newp,size_t newlen)

{
  _Bool _Var1;
  int iVar2;
  tsd_t *tsd;
  
  if (duckdb_je_malloc_init_state != malloc_init_initialized) {
    _Var1 = malloc_init_hard();
    if (_Var1) {
      return 0xb;
    }
  }
  tsd = (tsd_t *)__tls_get_addr(&PTR_02493488);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  iVar2 = duckdb_je_ctl_byname(tsd,name,oldp,oldlenp,newp,newlen);
  return iVar2;
}

Assistant:

JEMALLOC_NOTHROW
je_mallctl(const char *name, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	tsd_t *tsd;

	LOG("core.mallctl.entry", "name: %s", name);

	if (unlikely(malloc_init())) {
		LOG("core.mallctl.exit", "result: %d", EAGAIN);
		return EAGAIN;
	}

	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));
	ret = ctl_byname(tsd, name, oldp, oldlenp, newp, newlen);
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.mallctl.exit", "result: %d", ret);
	return ret;
}